

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O2

void __thiscall
bloaty::dwarf::CU::ReadHeader
          (CU *this,string_view entire_unit,string_view data,Section section,InfoReader *reader)

{
  CompilationUnitSizes *this_00;
  string_view data_00;
  byte bVar1;
  uchar uVar2;
  unsigned_short uVar3;
  unsigned_long uVar4;
  uint64_t uVar5;
  mapped_type *pmVar6;
  CU *pCVar7;
  Arg *a0;
  string_view format;
  string_view data_local;
  uint64_t debug_abbrev_offset;
  string_view abbrev_data;
  
  a0 = (Arg *)data._M_str;
  data_local._M_len = data._M_len;
  (this->entire_unit_)._M_len = entire_unit._M_len;
  (this->entire_unit_)._M_str = entire_unit._M_str;
  this->dwarf_ = reader->dwarf_;
  this->dwo_id_ = 0;
  data_local._M_str = (char *)a0;
  uVar3 = ReadFixed<unsigned_short,2ul>(&data_local);
  (this->unit_sizes_).dwarf_version_ = uVar3;
  bVar1 = (byte)uVar3;
  if (5 < bVar1) {
    absl::substitute_internal::Arg::Arg((Arg *)&abbrev_data,(uint)bVar1);
    format._M_str = (char *)&abbrev_data;
    format._M_len = (size_t)"Data is in DWARF $0 format which we don\'t understand";
    absl::Substitute_abi_cxx11_((string *)&debug_abbrev_offset,(absl *)0x34,format,a0);
    Throw((char *)debug_abbrev_offset,0x88);
  }
  this_00 = &this->unit_sizes_;
  if (bVar1 == 5) {
    uVar2 = ReadFixed<unsigned_char,1ul>(&data_local);
    this->unit_type_ = uVar2;
    uVar2 = ReadFixed<unsigned_char,1ul>(&data_local);
    CompilationUnitSizes::SetAddressSize(this_00,uVar2);
    debug_abbrev_offset = CompilationUnitSizes::ReadDWARFOffset(this_00,&data_local);
    switch(this->unit_type_) {
    case '\x01':
    case '\x03':
      break;
    case '\x02':
      goto switchD_001a5446_caseD_2;
    case '\x04':
    case '\x05':
    case '\x06':
      uVar4 = ReadFixed<unsigned_long,8ul>(&data_local);
      this->dwo_id_ = uVar4;
      break;
    default:
      fwrite("warning: Unknown DWARF Unit Type in user defined range\n",0x37,1,_stderr);
    }
  }
  else {
    debug_abbrev_offset = CompilationUnitSizes::ReadDWARFOffset(this_00,&data_local);
    uVar2 = ReadFixed<unsigned_char,1ul>(&data_local);
    CompilationUnitSizes::SetAddressSize(this_00,uVar2);
    if (section != kDebugTypes) goto switchD_001a5446_caseD_1;
switchD_001a5446_caseD_2:
    uVar4 = ReadFixed<unsigned_long,8ul>(&data_local);
    this->unit_type_signature_ = uVar4;
    uVar5 = CompilationUnitSizes::ReadDWARFOffset(this_00,&data_local);
    this->unit_type_offset_ = uVar5;
  }
switchD_001a5446_caseD_1:
  pmVar6 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>,_std::allocator<std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>,_std::allocator<std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&reader->abbrev_tables_,&debug_abbrev_offset);
  this->unit_abbrev_ = pmVar6;
  if ((pmVar6->abbrev_)._M_h._M_element_count == 0) {
    abbrev_data._M_len = (this->dwarf_->debug_abbrev)._M_len;
    abbrev_data._M_str = (this->dwarf_->debug_abbrev)._M_str;
    ReadBytes(debug_abbrev_offset,&abbrev_data);
    data_00._M_str = abbrev_data._M_str;
    data_00._M_len = abbrev_data._M_len;
    AbbrevTable::ReadAbbrevs(this->unit_abbrev_,data_00);
  }
  (this->data_)._M_len = data_local._M_len;
  (this->data_)._M_str = data_local._M_str;
  ReadTopLevelDIE(this,reader);
  pCVar7 = reader->skeleton_;
  if ((pCVar7 == (CU *)0x0) || (pCVar7->dwo_id_ != this->dwo_id_)) {
    pCVar7 = this;
  }
  this->skeleton_ = pCVar7;
  return;
}

Assistant:

void CU::ReadHeader(string_view entire_unit, string_view data,
                    InfoReader::Section section, InfoReader& reader) {
  entire_unit_ = entire_unit;
  dwarf_ = &reader.dwarf_;
  dwo_id_ = 0;
  unit_sizes_.ReadDWARFVersion(&data);

  if (unit_sizes_.dwarf_version() > 5) {
    THROWF("Data is in DWARF $0 format which we don't understand",
           unit_sizes_.dwarf_version());
  }

  uint64_t debug_abbrev_offset;

  if (unit_sizes_.dwarf_version() == 5) {
    unit_type_ = ReadFixed<uint8_t>(&data);
    unit_sizes_.SetAddressSize(ReadFixed<uint8_t>(&data));
    debug_abbrev_offset = unit_sizes_.ReadDWARFOffset(&data);

    switch (unit_type_) {
      case DW_UT_skeleton:
      case DW_UT_split_compile:
      case DW_UT_split_type:
        dwo_id_ = ReadFixed<uint64_t>(&data);
        break;
      case DW_UT_type:
        unit_type_signature_ = ReadFixed<uint64_t>(&data);
        unit_type_offset_ = unit_sizes_.ReadDWARFOffset(&data);
        break;
      case DW_UT_compile:
      case DW_UT_partial:
        break;
      default:
        fprintf(stderr, "warning: Unknown DWARF Unit Type in user defined range\n");
        break;
    }

  } else {
    debug_abbrev_offset = unit_sizes_.ReadDWARFOffset(&data);
    unit_sizes_.SetAddressSize(ReadFixed<uint8_t>(&data));

    if (section == InfoReader::Section::kDebugTypes) {
      unit_type_signature_ = ReadFixed<uint64_t>(&data);
      unit_type_offset_ = unit_sizes_.ReadDWARFOffset(&data);
    }
  }

  unit_abbrev_ = &reader.abbrev_tables_[debug_abbrev_offset];

  // If we haven't already read abbreviations for this debug_abbrev_offset_, we
  // need to do so now.
  if (unit_abbrev_->IsEmpty()) {
    string_view abbrev_data = dwarf_->debug_abbrev;
    SkipBytes(debug_abbrev_offset, &abbrev_data);
    unit_abbrev_->ReadAbbrevs(abbrev_data);
  }

  data_ = data;
  ReadTopLevelDIE(reader);

  if (reader.skeleton_ && reader.skeleton_->dwo_id_ == dwo_id_) {
    skeleton_ = reader.skeleton_;
  } else {
    skeleton_ = this;
  }
}